

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worn.c
# Opt level: O2

void mon_adjust_speed(monst *mon,int adjust,obj *obj)

{
  uint uVar1;
  boolean bVar2;
  char *pcVar3;
  byte bVar4;
  obj *poVar5;
  uint uVar6;
  char *pcVar7;
  char *line;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  bVar10 = in_mklev == '\0';
  uVar9 = *(uint *)&mon->field_0x60;
  uVar6 = uVar9 >> 10;
  bVar11 = true;
  bVar4 = 0;
  switch(adjust) {
  default:
    goto switchD_00276367_caseD_0;
  case 1:
    uVar1 = (uVar9 & 0xffffcfff) + 0x2000;
    bVar11 = (uVar9 & 0x3000) == 0x1000;
LAB_002763d8:
    uVar8 = uVar9 & 0xffffcfff;
    uVar9 = uVar1;
    if (bVar11) {
      uVar9 = uVar8;
    }
    bVar11 = true;
    bVar4 = 0;
    goto LAB_002763fb;
  case 2:
    uVar9 = uVar9 & 0xffffcfff | 0x2000;
    break;
  case -3:
    if ((uVar9 & 0x3000) != 0x2000) {
      bVar4 = 1;
      bVar11 = false;
      goto switchD_00276367_caseD_0;
    }
    uVar9 = uVar9 & 0xffffcfff;
    bVar4 = 1;
    bVar11 = false;
    goto LAB_002763fb;
  case -2:
    uVar9 = uVar9 & 0xffffcfff | 0x1000;
    break;
  case -1:
    uVar1 = (uVar9 & 0xffffcfff) + 0x1000;
    bVar11 = (uVar9 & 0x3000) == 0x2000;
    goto LAB_002763d8;
  }
  bVar11 = true;
  bVar4 = 0;
  bVar10 = false;
LAB_002763fb:
  *(uint *)&mon->field_0x60 = uVar9;
switchD_00276367_caseD_0:
  uVar6 = uVar6 & 3;
  poVar5 = (obj *)&mon->minvent;
  do {
    poVar5 = poVar5->nobj;
    if (poVar5 == (obj *)0x0) {
      uVar9 = uVar9 & 0xfffff3ff | uVar9 >> 2 & 0xc00;
      goto LAB_00276454;
    }
  } while ((poVar5->owornmask == 0) || (objects[poVar5->otyp].oc_oprop != '\x1a'));
  uVar9 = uVar9 & 0xfffff3ff | 0x800;
LAB_00276454:
  *(uint *)&mon->field_0x60 = uVar9;
  if (!bVar10) {
    return;
  }
  if ((bool)(~bVar4 & (uVar9 >> 10 & 3) == uVar6)) {
    return;
  }
  if (mon->wormno != '\0') {
    bVar2 = worm_known(level,mon);
    if (bVar2 == '\0') {
      return;
    }
    uVar9 = *(uint *)&mon->field_0x60;
    goto LAB_0027655f;
  }
  if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_0027655f;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002764ee;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002764e5;
  }
  else {
LAB_002764e5:
    if (ublindf == (obj *)0x0) {
      return;
    }
LAB_002764ee:
    if (ublindf->oartifact != '\x1d') {
      return;
    }
  }
  if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
     (((youmonst.data)->mflags3 & 0x100) == 0)) {
    return;
  }
  if ((viz_array[mon->my][mon->mx] & 1U) == 0) {
    return;
  }
  if ((mon->data->mflags3 & 0x200) == 0) {
    return;
  }
LAB_0027655f:
  if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar9 & 0x280) != 0) {
      return;
    }
  }
  else {
    if ((uVar9 & 0x280) != 0) {
      return;
    }
    if (((youmonst.data)->mflags1 & 0x1000000) == 0) {
      return;
    }
  }
  if ((u._1052_1_ & 0x20) == 0) {
    uVar9 = uVar9 >> 10 & 3;
    pcVar7 = "";
    if (uVar6 + uVar9 == 3) {
      pcVar7 = "much ";
    }
    if (bVar11) {
      pcVar3 = Monnam(mon);
      if ((adjust < 1) && (uVar9 != 2)) {
        line = "%s seems to be moving %sslower.";
      }
      else {
        line = "%s is suddenly moving %sfaster.";
      }
      pline(line,pcVar3,pcVar7);
    }
    else if (flags.verbose != '\0') {
      pcVar7 = Monnam(mon);
      pline("%s is slowing down.",pcVar7);
    }
    if (obj != (obj *)0x0) {
      if ((obj->oprops & 0x20) == 0) {
        if (((obj->field_0x4a & 0x20) != 0) && (objects[obj->otyp].oc_class != '\n')) {
          discover_object((int)obj->otyp,'\x01','\x01');
          return;
        }
      }
      else {
        *(byte *)&obj->oprops_known = (byte)obj->oprops_known | 0x20;
      }
    }
  }
  return;
}

Assistant:

void mon_adjust_speed(struct monst *mon,
		      int adjust, /* positive => increase speed, negative => decrease */
		      struct obj *obj)	/* item to make known if effect can be seen */
{
    struct obj *otmp;
    boolean give_msg = !in_mklev, petrify = FALSE;
    unsigned int oldspeed = mon->mspeed;

    switch (adjust) {
     case  2:
	mon->permspeed = MFAST;
	give_msg = FALSE;	/* special case monster creation */
	break;
     case  1:
	if (mon->permspeed == MSLOW) mon->permspeed = 0;
	else mon->permspeed = MFAST;
	break;
     case  0:			/* just check for worn speed boots */
	break;
     case -1:
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	else mon->permspeed = MSLOW;
	break;
     case -2:
	mon->permspeed = MSLOW;
	give_msg = FALSE;	/* (not currently used) */
	break;
     case -3:			/* petrification */
	/* take away intrinsic speed but don't reduce normal speed */
	if (mon->permspeed == MFAST) mon->permspeed = 0;
	petrify = TRUE;
	break;
    }

    for (otmp = mon->minvent; otmp; otmp = otmp->nobj)
	if (otmp->owornmask && objects[otmp->otyp].oc_oprop == FAST)
	    break;
    if (otmp)		/* speed boots */
	mon->mspeed = MFAST;
    else
	mon->mspeed = mon->permspeed;

    if (give_msg && (mon->mspeed != oldspeed || petrify) && canseemon(level, mon)) {
	/* fast to slow (skipping intermediate state) or vice versa */
	const char *howmuch = (mon->mspeed + oldspeed == MFAST + MSLOW) ?
				"much " : "";

	if (petrify) {
	    /* mimic the player's petrification countdown; "slowing down"
	       even if fast movement rate retained via worn speed boots */
	    if (flags.verbose) pline("%s is slowing down.", Monnam(mon));
	} else if (adjust > 0 || mon->mspeed == MFAST)
	    pline("%s is suddenly moving %sfaster.", Monnam(mon), howmuch);
	else
	    pline("%s seems to be moving %sslower.", Monnam(mon), howmuch);

	/* might discover an object if we see the speed change happen, but
	   avoid making possibly forgotten book known when casting its spell */
	if (obj) {
	    if (obj->oprops & ITEM_SPEED)
		obj->oprops_known |= ITEM_SPEED;
	    else if (obj->dknown && objects[obj->otyp].oc_class != SPBOOK_CLASS)
		makeknown(obj->otyp);
	}
    }
}